

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseRefType(WastParser *this,Type *out_type)

{
  TokenType TVar1;
  Result RVar2;
  long lVar3;
  allocator<char> local_a1;
  Type type;
  Token token;
  string local_38;
  
  TVar1 = Peek(this,0);
  if (TVar1 == First_Type) {
    Consume(&token,this);
    type = Token::type(&token);
    if ((type.enum_ == ExternRef) && ((this->options_->features).reference_types_enabled_ == false))
    {
      Type::GetName_abi_cxx11_(&local_38,&type);
      Error(this,0x18d235,local_38._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      RVar2.enum_ = Error;
    }
    else {
      *out_type = type;
      RVar2.enum_ = Ok;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&token,"funcref",(allocator<char> *)&type);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&token.token_type_,"externref",&local_a1);
    local_38._M_dataplus._M_p = (pointer)0x0;
    local_38._M_string_length = 0;
    local_38.field_2._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,&token
               ,&local_38);
    RVar2 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_38,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_38);
    lVar3 = 0x20;
    do {
      std::__cxx11::string::_M_dispose();
      lVar3 = lVar3 + -0x20;
    } while (lVar3 != -0x20);
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result WastParser::ParseRefType(Type* out_type) {
  WABT_TRACE(ParseRefType);
  if (!PeekMatch(TokenType::ValueType)) {
    return ErrorExpected({"funcref", "externref"});
  }

  Token token = Consume();
  Type type = token.type();
  if (type == Type::ExternRef &&
      !options_->features.reference_types_enabled()) {
    Error(token.loc, "value type not allowed: %s", type.GetName().c_str());
    return Result::Error;
  }

  *out_type = type;
  return Result::Ok;
}